

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O2

DdNode * cuddAddOuterSumRecur(DdManager *dd,DdNode *M,DdNode *r,DdNode *c)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *c_00;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int iVar7;
  DdNode *r_00;
  DdNode *c_01;
  int iVar8;
  int iVar9;
  
  pDVar6 = M;
  if (dd->plusinfinity != c && dd->plusinfinity != r) {
    if ((c->index == 0x7fffffff) && (r->index == 0x7fffffff)) {
      pDVar3 = cuddUniqueConst(dd,*(double *)(((ulong)c & 0xfffffffffffffffe) + 0x10) +
                                  *(double *)(((ulong)r & 0xfffffffffffffffe) + 0x10));
      uVar4 = (ulong)pDVar3 & 0xfffffffffffffffe;
      iVar7 = *(int *)(uVar4 + 4);
      *(int *)(uVar4 + 4) = iVar7 + 1;
      if (M->index == 0x7fffffff) {
        if ((pDVar3->type).value <= (M->type).value) {
          *(int *)(uVar4 + 4) = iVar7;
          pDVar6 = pDVar3;
        }
        else {
          Cudd_RecursiveDeref(dd,pDVar3);
        }
      }
      else {
        pDVar6 = Cudd_addApply(dd,Cudd_addMinimum,pDVar3,M);
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar3);
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      pDVar6 = cuddCacheLookup(dd,0x6e,M,r,c);
      if (pDVar6 == (DdNode *)0x0) {
        iVar2 = 0x7fffffff;
        iVar7 = 0x7fffffff;
        if ((ulong)M->index != 0x7fffffff) {
          iVar7 = dd->perm[M->index];
        }
        if ((ulong)r->index != 0x7fffffff) {
          iVar2 = dd->perm[r->index];
        }
        iVar8 = 0x7fffffff;
        if ((ulong)c->index != 0x7fffffff) {
          iVar8 = dd->perm[c->index];
        }
        iVar9 = iVar2;
        if (iVar8 < iVar2) {
          iVar9 = iVar8;
        }
        pDVar3 = M;
        pDVar6 = M;
        if (iVar7 <= iVar9) {
          pDVar6 = (M->type).kids.T;
          pDVar3 = (M->type).kids.E;
          iVar9 = iVar7;
        }
        r_00 = r;
        pDVar5 = r;
        if (iVar2 == iVar9) {
          pDVar5 = (r->type).kids.T;
          r_00 = (r->type).kids.E;
        }
        c_00 = c;
        c_01 = c;
        if (iVar8 == iVar9) {
          c_01 = (c->type).kids.T;
          c_00 = (c->type).kids.E;
        }
        pDVar6 = cuddAddOuterSumRecur(dd,pDVar6,pDVar5,c_01);
        if (pDVar6 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar3 = cuddAddOuterSumRecur(dd,pDVar3,r_00,c_00);
          if (pDVar3 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar5 = pDVar6;
            if ((pDVar6 == pDVar3) ||
               (pDVar5 = cuddUniqueInter(dd,dd->invperm[iVar9],pDVar6,pDVar3),
               pDVar5 != (DdNode *)0x0)) {
              piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              cuddCacheInsert(dd,0x6e,M,r,c,pDVar5);
              return pDVar5;
            }
            Cudd_RecursiveDeref(dd,pDVar6);
            pDVar6 = pDVar3;
          }
          Cudd_RecursiveDeref(dd,pDVar6);
        }
        pDVar6 = (DdNode *)0x0;
      }
    }
  }
  return pDVar6;
}

Assistant:

static DdNode *
cuddAddOuterSumRecur(
  DdManager *dd,
  DdNode *M,
  DdNode *r,
  DdNode *c)
{
    DdNode *P, *R, *Mt, *Me, *rt, *re, *ct, *ce, *Rt, *Re;
    int topM, topc, topr;
    int v, index;

    statLine(dd);
    /* Check special cases. */
    if (r == DD_PLUS_INFINITY(dd) || c == DD_PLUS_INFINITY(dd)) return(M); 

    if (cuddIsConstant(c) && cuddIsConstant(r)) {
        R = cuddUniqueConst(dd,Cudd_V(c)+Cudd_V(r));
        cuddRef(R);
        if (cuddIsConstant(M)) {
            if (cuddV(R) <= cuddV(M)) {
                cuddDeref(R);
                return(R);
            } else {
                Cudd_RecursiveDeref(dd,R);       
                return(M);
            }
        } else {
            P = Cudd_addApply(dd,Cudd_addMinimum,R,M);
            cuddRef(P);
            Cudd_RecursiveDeref(dd,R);
            cuddDeref(P);
            return(P);
        }
    }

    /* Check the cache. */
    R = cuddCacheLookup(dd,DD_ADD_OUT_SUM_TAG,M,r,c);
    if (R != NULL) return(R);

    topM = cuddI(dd,M->index); topr = cuddI(dd,r->index);
    topc = cuddI(dd,c->index);
    v = ddMin(topM,ddMin(topr,topc));

    /* Compute cofactors. */
    if (topM == v) { Mt = cuddT(M); Me = cuddE(M); } else { Mt = Me = M; }
    if (topr == v) { rt = cuddT(r); re = cuddE(r); } else { rt = re = r; }
    if (topc == v) { ct = cuddT(c); ce = cuddE(c); } else { ct = ce = c; }

    /* Recursively solve. */
    Rt = cuddAddOuterSumRecur(dd,Mt,rt,ct);
    if (Rt == NULL) return(NULL);
    cuddRef(Rt);
    Re = cuddAddOuterSumRecur(dd,Me,re,ce);
    if (Re == NULL) {
        Cudd_RecursiveDeref(dd, Rt);
        return(NULL);
    }
    cuddRef(Re);
    index = dd->invperm[v];
    R = (Rt == Re) ? Rt : cuddUniqueInter(dd,index,Rt,Re);
    if (R == NULL) {
        Cudd_RecursiveDeref(dd, Rt);
        Cudd_RecursiveDeref(dd, Re);
        return(NULL);
    }
    cuddDeref(Rt);
    cuddDeref(Re);

    /* Store the result in the cache. */
    cuddCacheInsert(dd,DD_ADD_OUT_SUM_TAG,M,r,c,R);

    return(R);

}